

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio_internal.c
# Opt level: O0

uint32_t FAudio_INTERNAL_VoiceOutputFrequency(FAudioVoice *voice,FAudioVoiceSends *pSendList)

{
  int iVar1;
  ulong uVar2;
  int *in_RSI;
  long *in_RDI;
  double dVar3;
  uint64_t resampleSanityCheck;
  uint32_t newResampleSamples;
  uint32_t outSampleRate;
  uint local_2c;
  uint local_1c;
  
  if ((in_RSI == (int *)0x0) || (*in_RSI == 0)) {
    local_1c = *(uint *)(*(long *)(*in_RDI + 0x10) + 0xdc);
  }
  else {
    if (*(int *)(*(long *)(*(long *)(in_RSI + 1) + 4) + 0xc) == 2) {
      local_2c = *(uint *)(*(long *)(*(long *)(in_RSI + 1) + 4) + 0xdc);
    }
    else {
      local_2c = *(uint *)(*(long *)(*(long *)(in_RSI + 1) + 4) + 0xec);
    }
    local_1c = local_2c;
  }
  dVar3 = (double)SDL_ceil(((double)*(uint *)(*in_RDI + 0xc) * (double)local_1c) /
                           (double)*(uint *)(*(long *)(*in_RDI + 0x10) + 0xdc));
  iVar1 = (int)(long)dVar3;
  if (*(int *)((long)in_RDI + 0xc) == 0) {
    if (((*(int *)((long)in_RDI + 0xcc) != 0) && (iVar1 != *(int *)((long)in_RDI + 0xcc))) &&
       (*(int *)((long)in_RDI + 0x4c) != 0)) {
      return 0x88960001;
    }
    *(int *)((long)in_RDI + 0xcc) = iVar1;
  }
  else {
    if (((*(int *)((long)in_RDI + 0xcc) != 0) && (iVar1 != *(int *)((long)in_RDI + 0xcc))) &&
       (*(int *)((long)in_RDI + 0x4c) != 0)) {
      return 0x88960001;
    }
    *(int *)((long)in_RDI + 0xcc) = iVar1;
    dVar3 = ((double)*(uint *)((long)in_RDI + 0xec) / (double)local_1c) * 4294967296.0 + 0.5;
    uVar2 = (ulong)dVar3;
    in_RDI[0x1b] = uVar2 | (long)(dVar3 - 9.223372036854776e+18) & (long)uVar2 >> 0x3f;
    if ((ulong)*(uint *)(in_RDI + 0x19) / (ulong)*(uint *)(in_RDI + 0x1d) <
        in_RDI[0x1b] * (ulong)*(uint *)((long)in_RDI + 0xcc) >> 0x20) {
      *(int *)((long)in_RDI + 0xcc) = *(int *)((long)in_RDI + 0xcc) + -1;
    }
  }
  return 0;
}

Assistant:

uint32_t FAudio_INTERNAL_VoiceOutputFrequency(
	FAudioVoice *voice,
	const FAudioVoiceSends *pSendList
) {
	uint32_t outSampleRate;
	uint32_t newResampleSamples;
	uint64_t resampleSanityCheck;

	LOG_FUNC_ENTER(voice->audio)

	if ((pSendList == NULL) || (pSendList->SendCount == 0))
	{
		/* When we're deliberately given no sends, use master rate! */
		outSampleRate = voice->audio->master->master.inputSampleRate;
	}
	else
	{
		outSampleRate = pSendList->pSends[0].pOutputVoice->type == FAUDIO_VOICE_MASTER ?
			pSendList->pSends[0].pOutputVoice->master.inputSampleRate :
			pSendList->pSends[0].pOutputVoice->mix.inputSampleRate;
	}
	newResampleSamples = (uint32_t) FAudio_ceil(
		voice->audio->updateSize *
		(double) outSampleRate /
		(double) voice->audio->master->master.inputSampleRate
	);
	if (voice->type == FAUDIO_VOICE_SOURCE)
	{
		if (	(voice->src.resampleSamples != 0) &&
			(newResampleSamples != voice->src.resampleSamples) &&
			(voice->effects.count > 0)	)
		{
			LOG_FUNC_EXIT(voice->audio)
			return FAUDIO_E_INVALID_CALL;
		}
		voice->src.resampleSamples = newResampleSamples;
	}
	else /* (voice->type == FAUDIO_VOICE_SUBMIX) */
	{
		if (	(voice->mix.outputSamples != 0) &&
			(newResampleSamples != voice->mix.outputSamples) &&
			(voice->effects.count > 0)	)
		{
			LOG_FUNC_EXIT(voice->audio)
			return FAUDIO_E_INVALID_CALL;
		}
		voice->mix.outputSamples = newResampleSamples;

		voice->mix.resampleStep = DOUBLE_TO_FIXED((
			(double) voice->mix.inputSampleRate /
			(double) outSampleRate
		));

		/* Because we used ceil earlier, there's a chance that
		 * downsampling submixes will go past the number of samples
		 * available. Sources can do this thanks to padding, but we
		 * don't have that luxury for submixes, so unfortunately we
		 * just have to undo the ceil and turn it into a floor.
		 * -flibit
		 */
		resampleSanityCheck = (
			voice->mix.resampleStep * voice->mix.outputSamples
		) >> FIXED_PRECISION;
		if (resampleSanityCheck > (voice->mix.inputSamples / voice->mix.inputChannels))
		{
			voice->mix.outputSamples -= 1;
		}
	}

	LOG_FUNC_EXIT(voice->audio)
	return 0;
}